

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

bool __thiscall AActor::SetState(AActor *this,FState *newstate,bool nofunction)

{
  player_t *ppVar1;
  FPlayerSkin *pFVar2;
  bool bVar3;
  ushort uVar4;
  int iVar5;
  uint uVar6;
  FState *returned_state;
  FStateParamInfo stp;
  
  if (((debugfile != (FILE *)0x0) && (ppVar1 = this->player, ppVar1 != (player_t *)0x0)) &&
     ((ppVar1->cheats & 0x2000) != 0)) {
    fprintf((FILE *)debugfile,"for pl %td: SetState while predicting!\n",
            (long)(ppVar1[-0x3b4b].frags + 7) / 0x2a0);
  }
LAB_004ba042:
  do {
    if (newstate == (FState *)0x0) {
      this->state = (FState *)0x0;
      (*(this->super_DThinker).super_DObject._vptr_DObject[4])(this);
      return false;
    }
    uVar6 = 0xffffffff;
    if (this->state != (FState *)0x0) {
      uVar6 = (uint)this->state->sprite;
    }
    this->state = newstate;
    iVar5 = GetTics(this,newstate);
    this->tics = iVar5;
    (this->renderflags).Value =
         ((byte)newstate->field_0x22 & 1) << 4 | (this->renderflags).Value & 0xffffffef;
    uVar4 = newstate->sprite;
    if (uVar4 != 1) {
      if ((newstate->field_0x22 & 2) == 0) {
        this->frame = newstate->Frame;
      }
      pFVar2 = skins;
      if (uVar4 != 2) {
        if ((((this->flags4).Value & 0x20) == 0) && (uVar4 == this->SpawnState->sprite)) {
          if (skins == (FPlayerSkin *)0x0 || this->player == (player_t *)0x0) {
            if (uVar6 == uVar4) goto LAB_004ba129;
          }
          else {
            iVar5 = userinfo_t::GetSkin(&this->player->userinfo);
            uVar4 = (ushort)pFVar2[iVar5].sprite;
          }
        }
        this->sprite = uVar4;
      }
    }
LAB_004ba129:
    if (!nofunction) {
      stp.mStateType = STATE_Actor;
      stp.mPSPIndex = 1;
      stp.mCallingState = newstate;
      bVar3 = FState::CallAction(newstate,this,this,&stp,&returned_state);
      if (bVar3) {
        if (((this->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
          return false;
        }
        if (returned_state != (FState *)0x0) {
          this->tics = 0;
          newstate = returned_state;
          goto LAB_004ba042;
        }
      }
    }
    newstate = newstate->NextState;
    if (this->tics != 0) {
      if (Renderer != (FRenderer *)0x0) {
        (*Renderer->_vptr_FRenderer[8])(Renderer,this);
      }
      return true;
    }
  } while( true );
}

Assistant:

bool AActor::SetState (FState *newstate, bool nofunction)
{
	if (debugfile && player && (player->cheats & CF_PREDICTING))
		fprintf (debugfile, "for pl %td: SetState while predicting!\n", player-players);
	do
	{
		if (newstate == NULL)
		{
			state = NULL;
			Destroy ();
			return false;
		}
		int prevsprite, newsprite;

		if (state != NULL)
		{
			prevsprite = state->sprite;
		}
		else
		{
			prevsprite = -1;
		}
		state = newstate;
		tics = GetTics(newstate);
		renderflags = (renderflags & ~RF_FULLBRIGHT) | ActorRenderFlags::FromInt (newstate->GetFullbright());
		newsprite = newstate->sprite;
		if (newsprite != SPR_FIXED)
		{ // okay to change sprite and/or frame
			if (!newstate->GetSameFrame())
			{ // okay to change frame
				frame = newstate->GetFrame();
			}
			if (newsprite != SPR_NOCHANGE)
			{ // okay to change sprite
				if (!(flags4 & MF4_NOSKIN) && newsprite == SpawnState->sprite)
				{ // [RH] If the new sprite is the same as the original sprite, and
				// this actor is attached to a player, use the player's skin's
				// sprite. If a player is not attached, do not change the sprite
				// unless it is different from the previous state's sprite; a
				// player may have been attached, died, and respawned elsewhere,
				// and we do not want to lose the skin on the body. If it wasn't
				// for Dehacked, I would move sprite changing out of the states
				// altogether, since actors rarely change their sprites after
				// spawning.
					if (player != NULL && skins != NULL)
					{
						sprite = skins[player->userinfo.GetSkin()].sprite;
					}
					else if (newsprite != prevsprite)
					{
						sprite = newsprite;
					}
				}
				else
				{
					sprite = newsprite;
				}
			}
		}

		if (!nofunction)
		{
			FState *returned_state;
			FStateParamInfo stp = { newstate, STATE_Actor, PSP_WEAPON };
			if (newstate->CallAction(this, this, &stp, &returned_state))
			{
				// Check whether the called action function resulted in destroying the actor
				if (ObjectFlags & OF_EuthanizeMe)
				{
					return false;
				}
				if (returned_state != NULL)
				{ // The action was an A_Jump-style function that wants to change the next state.
					newstate = returned_state;
					tics = 0;		 // make sure we loop and set the new state properly
					continue;
				}
			}
		}
		newstate = newstate->GetNextState();
	} while (tics == 0);

	if (Renderer != NULL)
	{
		Renderer->StateChanged(this);
	}
	return true;
}